

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O2

string * pstore::broker::gc_watch_thread::vacuumd_path_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  process_file_name_abi_cxx11_();
  pstore::path::posix::dir_name(&local_50,&local_30);
  std::__cxx11::string::string((string *)&local_70,"pstore-vacuumd",&local_71);
  pstore::path::posix::join(in_RDI,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string gc_watch_thread::vacuumd_path () {
            using path::dir_name;
            using path::join;
            return join (dir_name (process_file_name ()), vacuumd_name);
        }